

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::RangeEnc_FlushStream(CRangeEnc *p)

{
  size_t sVar1;
  size_t sVar2;
  size_t num;
  CRangeEnc *p_local;
  
  if (p->res == 0) {
    sVar1 = (long)p->buf - (long)p->bufBase;
    sVar2 = (*p->outStream->Write)(p->outStream,p->bufBase,sVar1);
    if (sVar1 != sVar2) {
      p->res = 9;
    }
    p->processed = sVar1 + p->processed;
    p->buf = p->bufBase;
  }
  return;
}

Assistant:

static void RangeEnc_FlushStream(CRangeEnc* p) {
  size_t num;
  if (p->res != SZ_OK)
    return;
  num = p->buf - p->bufBase;
  if (num != p->outStream->Write(p->outStream, p->bufBase, num))
    p->res = SZ_ERROR_WRITE;
  p->processed += num;
  p->buf = p->bufBase;
}